

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<float_const&>::captureExpression<(Catch::Internal::Operator)0,float>
          (ExpressionLhs<float_const&> *this,float *rhs)

{
  ResultBuilder *pRVar1;
  Catch *this_00;
  string *__return_storage_ptr__;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  this_00 = (Catch *)(ulong)(**(float **)(this + 8) == *rhs);
  pRVar1 = ResultBuilder::setResultType(*(ResultBuilder **)this,**(float **)(this + 8) == *rhs);
  __return_storage_ptr__ = &local_38;
  Catch::toString_abi_cxx11_(__return_storage_ptr__,this_00,**(float **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,__return_storage_ptr__);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)__return_storage_ptr__,*rhs);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  std::__cxx11::string::string((string *)&local_78,"==",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }